

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
Compiler::processScope
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  InstructionGenerator *pIVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  int iVar2;
  ScopeType SVar3;
  pointer puVar4;
  pointer puVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer pSVar8;
  pointer pcVar9;
  pointer pSVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  DataType DVar14;
  uint uVar15;
  iterator __position;
  int *piVar16;
  ulonglong uVar17;
  Variable *pVVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *psVar19;
  pointer puVar20;
  pointer ppVar21;
  long lVar22;
  undefined8 uVar23;
  Scope *__p;
  _Alloc_hider _Var25;
  Parser *pPVar26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  initialisationArguments;
  string arraySize;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  argumentNames;
  Scope endingScope;
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  undefined1 local_218 [20];
  uint local_204;
  vector<Scope,std::allocator<Scope>> *local_200;
  undefined1 local_1f8 [32];
  InstructionGenerator *local_1d8;
  Parser *local_1d0;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  Parser *local_168;
  new_allocator<Scope> *local_160;
  string local_158;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  size_type local_110;
  char local_108 [16];
  _Alloc_hider local_f8 [2];
  char local_e8 [20];
  uint local_d4;
  vector<Scope,_std::allocator<Scope>_> local_c0;
  vector<Variable,_std::allocator<Variable>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  vector<Scope,std::allocator<Scope>> *pvVar24;
  
  iVar12 = std::__cxx11::string::compare
                     ((char *)(line->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
  if (iVar12 == 0) {
    Scope::Scope((Scope *)local_138,&this->expectedScopeType);
    local_138._4_4_ =
         (int)((ulong)((long)(this->bytecode).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->bytecode).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    local_138._8_4_ = this->scopeDepth;
    pIVar1 = &this->igen;
    local_138._16_4_ = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
    SVar3 = (this->expectedScopeType).type;
    if (SVar3 == FUNCTION) {
      local_1a8._M_allocated_capacity = 0;
      local_1a8._8_8_ = (vector<Scope,std::allocator<Scope>> *)0x0;
      local_198 = 0;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_118._M_p,local_118._M_p + local_110);
      pPVar26 = &this->parser;
      Parser::extractBracketArguments
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_230,pPVar26,&local_50);
      Parser::tokenizeFile
                (pPVar26,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_230,
                 (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_1a8._8_8_ != local_1a8._M_allocated_capacity) {
        uVar23 = local_1a8._8_8_;
        local_1d0 = pPVar26;
        do {
          DVar14 = stringToDataType(*(string **)(uVar23 + -0x18));
          lVar22 = *(long *)(uVar23 + -0x18);
          local_200 = (vector<Scope,std::allocator<Scope>> *)uVar23;
          bVar11 = Parser::isArrayDefinition(pPVar26,(string *)(lVar22 + 0x20));
          if (bVar11) {
            local_1f8._0_8_ = local_1f8 + 0x10;
            local_1f8._8_8_ = (pointer)0x0;
            local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
            local_1c8._0_8_ = local_1c8 + 0x10;
            local_1c8._8_8_ = (pointer)0x0;
            local_1c8[0x10] = '\0';
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*(long *)(lVar22 + 0x20),
                       *(long *)(lVar22 + 0x28) + *(long *)(lVar22 + 0x20));
            Parser::splitArrayDefinition(pPVar26,&local_90,(string *)local_1f8,(string *)local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,local_1c8._0_8_,
                       (char *)(local_1c8._0_8_ + (long)(_Alloc_hider *)local_1c8._8_8_));
            uVar15 = VirtualStack::isVariable(&pIVar1->super_VirtualStack,&local_158);
            line = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)uVar15;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            uVar23 = local_1c8._0_8_;
            if (0 < (int)uVar15) {
              psVar19 = (string *)__cxa_allocate_exception(0x20);
              *(string **)psVar19 = psVar19 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        (psVar19,"Arrays of a dynamic size are not currently supported sorry!","");
              __cxa_throw(psVar19,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            piVar16 = __errno_location();
            local_1d8 = (InstructionGenerator *)CONCAT44(local_1d8._4_4_,*piVar16);
            *piVar16 = 0;
            uVar17 = strtoull((char *)uVar23,(char **)local_230,10);
            if ((pointer)CONCAT44(local_230._4_4_,local_230._0_4_) == (pointer)uVar23) {
              std::__throw_invalid_argument("stoull");
              goto LAB_0010658e;
            }
            if (*piVar16 == 0) {
              *piVar16 = (int)local_1d8;
            }
            else if (*piVar16 == 0x22) {
              std::__throw_out_of_range("stoull");
switchD_00105aa5_default:
              psVar19 = (string *)__cxa_allocate_exception(0x20);
              *(string **)psVar19 = psVar19 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        (psVar19,"Ending unknown scope type","");
              __cxa_throw(psVar19,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            if ((uint)uVar17 == 0) {
              psVar19 = (string *)__cxa_allocate_exception(0x20);
              *(string **)psVar19 = psVar19 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        (psVar19,"Array must not contain no elements","");
              __cxa_throw(psVar19,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            local_230._0_4_ = DVar14;
            local_228._M_p = (pointer)local_218;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,local_1f8._0_8_,
                       (pointer)(local_1f8._0_8_ +
                                (long)(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_1f8._8_8_));
            pPVar26 = local_1d0;
            local_218[0x10] = false;
            local_204 = 0;
            VirtualStack::push(&pIVar1->super_VirtualStack,(Variable *)local_230);
            if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228._M_p !=
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218) {
              operator_delete(local_228._M_p);
            }
            uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
            pVVar18 = VirtualStack::getVariable(&pIVar1->super_VirtualStack,uVar15 - 1);
            pVVar18->isArray = true;
            pVVar18->arrayLength = (uint)uVar17;
            while (uVar15 = (int)uVar17 - 1, uVar17 = (ulonglong)uVar15, uVar15 != 0) {
              local_188 = local_178;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
              local_230._0_4_ = DVar14;
              local_228._M_p = (pointer)local_218;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_228,local_188,local_188 + local_180);
              local_218[0x10] = false;
              local_204 = 0;
              VirtualStack::push(&pIVar1->super_VirtualStack,(Variable *)local_230);
              if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_228._M_p !=
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_218) {
                operator_delete(local_228._M_p);
              }
              if (local_188 != local_178) {
                operator_delete(local_188);
              }
            }
            if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
              operator_delete((void *)local_1c8._0_8_);
            }
            pvVar24 = local_200;
            _Var25._M_p = (pointer)local_1f8._0_8_;
            if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8._0_8_ !=
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1f8 + 0x10)) goto LAB_001062cf;
          }
          else {
            local_230._0_4_ = DVar14;
            local_228._M_p = (pointer)local_218;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,*(long *)(lVar22 + 0x20),
                       *(long *)(lVar22 + 0x28) + *(long *)(lVar22 + 0x20));
            local_218[0x10] = false;
            local_204 = 0;
            VirtualStack::push(&pIVar1->super_VirtualStack,(Variable *)local_230);
            pvVar24 = local_200;
            _Var25._M_p = local_228._M_p;
            if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228._M_p !=
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218) {
LAB_001062cf:
              pvVar24 = local_200;
              operator_delete(_Var25._M_p);
            }
          }
          uVar23 = pvVar24 + -0x18;
        } while (uVar23 != local_1a8._M_allocated_capacity);
      }
      local_d4 = (int)((ulong)(local_1a8._8_8_ - local_1a8._0_8_) >> 3) * -0x55555555;
      std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                ((vector<Scope,std::allocator<Scope>> *)&this->functionCallStack,(Scope *)local_138)
      ;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_1a8);
    }
    else if (SVar3 == ELSE) {
      pSVar10 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar15 = pSVar10[-1].endPos;
      puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this_00 = &this->bytecode;
      pSVar10[-1].endPos = uVar15 + 1;
      local_230._0_4_ = 5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (this_00,(const_iterator)(puVar20 + uVar15),(value_type_conflict *)local_230);
      puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar15 = pSVar10[-1].endPos;
      pSVar10[-1].endPos = uVar15 + 1;
      local_230._0_4_ =
           (int)((ulong)((long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar20) >> 2) +
           CHAR;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (this_00,(const_iterator)(puVar20 + uVar15),(value_type_conflict *)local_230);
      puVar20 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start + (pSVar10[-1].startPos - 1);
      *puVar20 = *puVar20 + 2;
    }
    std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
              ((vector<Scope,std::allocator<Scope>> *)&this->openScopeStack,(Scope *)local_138);
    this->scopeDepth = this->scopeDepth + 1;
    std::vector<Variable,_std::allocator<Variable>_>::~vector(&local_a8);
    std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_c0);
    if (local_f8[0]._M_p != local_e8) {
      operator_delete(local_f8[0]._M_p);
    }
    if (local_118._M_p != local_108) {
      operator_delete(local_118._M_p);
    }
  }
  else {
    iVar12 = std::__cxx11::string::compare
                       ((char *)(line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
    if (iVar12 != 0) {
LAB_0010658e:
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "Error processing scope change, unknown operator \'",
                     (line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "\'");
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    iVar12 = this->scopeDepth;
    this->scopeDepth = iVar12 + -1;
    if (iVar12 < 1) {
      psVar19 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar19 = psVar19 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar19,"No such scope to close","");
      __cxa_throw(psVar19,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    local_1d0 = (Parser *)&this->openScopeStack;
    __position._M_current =
         (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_200 = (vector<Scope,std::allocator<Scope>> *)&this->pastScopes;
    local_160 = (new_allocator<Scope> *)&this->functionCallStack;
    local_1d8 = &this->igen;
    local_168 = &this->parser;
    do {
      pIVar1 = local_1d8;
      if (__position._M_current ==
          (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      iVar12 = (__position._M_current)->scopeDepth;
      iVar2 = this->scopeDepth;
      if (iVar12 != iVar2) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00105f72;
      }
      puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (((long)puVar4 - (long)puVar20 >> 2 == (ulong)(__position._M_current)->startPos) &&
         ((__position._M_current)->type != FUNCTION)) {
        puVar20 = puVar20 + (__position._M_current)->bytecodeSizeBefore;
        if ((puVar20 != puVar4) &&
           (puVar5 = (this->bytecode).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
           puVar20 = (pointer)((long)puVar20 + ((long)puVar5 - (long)puVar4)), puVar5 != puVar20)) {
          (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar20;
        }
        (__position._M_current)->wasOptimisedOut = true;
        (__position._M_current)->endPos =
             (uint)((ulong)((long)(this->bytecode).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                  (local_200,__position._M_current);
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,
                   "Empty scope. It has been optimised out, but removal is recommended.","");
        displayWarning(this,(string *)local_138);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_);
        }
        goto LAB_00105f72;
      }
      switch((__position._M_current)->type) {
      case IF:
        uVar15 = VirtualStack::getStackSize(&local_1d8->super_VirtualStack);
        if (uVar15 != (__position._M_current)->stackSize) {
          uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
          InstructionGenerator::genStackWalk(pIVar1,uVar15 - (__position._M_current)->stackSize);
        }
        goto LAB_00105ed4;
      case WHILE:
        uVar15 = VirtualStack::getStackSize(&local_1d8->super_VirtualStack);
        if (uVar15 != (__position._M_current)->stackSize) {
          uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
          InstructionGenerator::genStackWalk(pIVar1,uVar15 - (__position._M_current)->stackSize);
        }
        InstructionGenerator::genGoto(pIVar1,(__position._M_current)->statementPos);
LAB_00105ed4:
        puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar20[(__position._M_current)->startPos - 1] =
             (int)((ulong)((long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar20) >> 2) -
             1;
        break;
      case ELSE:
        uVar15 = VirtualStack::getStackSize(&local_1d8->super_VirtualStack);
        if (uVar15 != (__position._M_current)->stackSize) {
          uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
          InstructionGenerator::genStackWalk(pIVar1,uVar15 - (__position._M_current)->stackSize);
        }
        pSVar10 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pSVar10[-1].wasOptimisedOut == false) {
          puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar20[pSVar10[-1].endPos - 1] =
               (uint)((ulong)((long)(this->bytecode).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar20) >> 2)
          ;
        }
        break;
      case FOR:
        uVar15 = VirtualStack::getStackSize(&local_1d8->super_VirtualStack);
        if (uVar15 != (__position._M_current)->stackSize) {
          uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
          InstructionGenerator::genStackWalk(pIVar1,uVar15 - (__position._M_current)->stackSize);
        }
        pcVar9 = ((__position._M_current)->incrementor)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar9,
                   pcVar9 + ((__position._M_current)->incrementor)._M_string_length);
        pPVar26 = local_168;
        Parser::extractBracketArguments
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_230,local_168,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_1f8._0_8_ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        local_1f8._8_8_ = (pointer)0x0;
        local_1f8._16_8_ = (pointer)0x0;
        local_138._0_8_ = local_138 + 0x10;
        lVar22 = *(long *)CONCAT44(local_230._4_4_,local_230._0_4_);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,lVar22,
                   ((long *)CONCAT44(local_230._4_4_,local_230._0_4_))[1] + lVar22);
        pIVar1 = local_1d8;
        __l._M_len = 1;
        __l._M_array = (iterator)local_138;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,__l,(allocator_type *)&local_188);
        Parser::tokenizeFile
                  (pPVar26,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,
                   (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_);
        }
        processVariable(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1f8._0_8_);
        InstructionGenerator::genGoto(pIVar1,(__position._M_current)->statementPos);
        puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar20[(__position._M_current)->startPos - 1] =
             (int)((ulong)((long)(this->bytecode).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar20) >> 2) -
             1;
        InstructionGenerator::genStackWalk
                  (pIVar1,(__position._M_current)->initialisationVariableCount);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_230);
        break;
      case FUNCTION:
        Scope::Scope((Scope *)local_138,
                     (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
        __p = (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
        (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
        super__Vector_impl_data._M_finish = __p;
        __gnu_cxx::new_allocator<Scope>::destroy<Scope>(local_160,__p);
        ppVar6 = (this->functionEndGotos).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = (this->functionEndGotos).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar6 != ppVar7) {
          pSVar10 = (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pSVar8 = (this->functionCallStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar20 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar4 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          do {
            ppVar21 = ppVar7 + -1;
            if (((long)pSVar10 - (long)pSVar8 >> 3) * -0x30c30c30c30c30c3 - (ulong)ppVar21->first !=
                0) break;
            puVar20[ppVar7[-1].second] = (uint)((ulong)((long)puVar4 - (long)puVar20) >> 2);
            (this->functionEndGotos).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar21;
            ppVar7 = ppVar21;
          } while (ppVar21 != ppVar6);
        }
        uVar15 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
        uVar15 = uVar15 - local_138._16_4_;
        if ((uVar15 != 0) && (iVar13 = std::__cxx11::string::compare((char *)local_f8), iVar13 != 0)
           ) {
          InstructionGenerator::genStackWalk(pIVar1,uVar15);
        }
        iVar13 = std::__cxx11::string::compare((char *)local_f8);
        if (iVar13 != 0) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"returnPoint","");
          local_230._0_4_ = INT;
          local_228._M_p = local_218;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,local_1f8._0_8_,
                     (pointer)(local_1f8._0_8_ +
                              (long)(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_1f8._8_8_));
          local_218[0x10] = false;
          local_204 = 0;
          VirtualStack::push(&pIVar1->super_VirtualStack,(Variable *)local_230);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228._M_p !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_218) {
            operator_delete(local_228._M_p);
          }
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8._0_8_ !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_);
          }
          InstructionGenerator::genDynamicGoto(pIVar1);
        }
        std::vector<Variable,_std::allocator<Variable>_>::~vector(&local_a8);
        std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_c0);
        if (local_f8[0]._M_p != local_e8) {
          operator_delete(local_f8[0]._M_p);
        }
        if (local_118._M_p != local_108) {
          operator_delete(local_118._M_p);
        }
        break;
      default:
        goto switchD_00105aa5_default;
      }
      (__position._M_current)->endPos =
           (uint)((ulong)((long)(this->bytecode).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      pSVar10 = (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar22 = (long)(this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar10;
      pvVar24 = local_200;
      if ((1 < (ulong)((lVar22 >> 3) * -0x30c30c30c30c30c3)) &&
         (pvVar24 = (vector<Scope,std::allocator<Scope>> *)((long)pSVar10 + lVar22 + -0xd8),
         *(int *)((long)pSVar10 + lVar22 + -0x150) != 5)) {
        pvVar24 = local_200;
      }
      std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>(pvVar24,__position._M_current);
      __position = std::vector<Scope,_std::allocator<Scope>_>::_M_erase
                             ((vector<Scope,_std::allocator<Scope>_> *)local_1d0,__position);
LAB_00105f72:
    } while (iVar12 != iVar2);
  }
  return;
}

Assistant:

void Compiler::processScope(const std::vector<std::string> &line)
{
    if(line[0] == "{") //Scope open
    {
        //Setup the new scope, taking details from the expected scope and filling in the '{' dependent stuff
        Scope newScope = expectedScopeType;
        newScope.startPos = bytecode.size();
        newScope.scopeDepth = scopeDepth;
        newScope.stackSize = igen.getStackSize();

        if(expectedScopeType.type == Scope::ELSE)
        {
            Scope &previousScope = pastScopes.back(); // Get preceding scope
            bytecode.insert(bytecode.begin() + previousScope.endPos++, Instruction::GOTO);
            bytecode.insert(bytecode.begin() + previousScope.endPos++, bytecode.size()+1); //Temporary value, this will be filled in later.
            bytecode[previousScope.startPos-1] += 2;
        }
        else if(expectedScopeType.type == Scope::FUNCTION)
        {
            std::vector<std::vector<std::string>> argumentNames;
            parser.tokenizeFile(parser.extractBracketArguments(newScope.incrementor), argumentNames);
            for(auto iter = argumentNames.rbegin(); iter != argumentNames.rend(); iter++)
            {
                DataType type = stringToDataType((*iter)[0]);
                std::string &identifier = (*iter)[1];
                if(parser.isArrayDefinition(identifier)) //Check if it's an array
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(identifier, arrayName, arraySize);

                    //Quick error check
                    if(igen.isVariable(arraySize) > 0)
                        throw std::string("Arrays of a dynamic size are not currently supported sorry!");

                    //Get array size as an integer
                    unsigned int aSize = std::stoull(arraySize);
                    if(aSize == 0)
                        throw std::string("Array must not contain no elements");

                    //Create first element with a name
                    igen.push(Variable(arrayName, type));

                    //Set it to an array
                    Variable &var = igen.getVariable(igen.getStackSize()-1);
                    var.isArray = true;
                    var.arrayLength = aSize;

                    //All elements after are unnamed so that when searching for the array, the first element will always be returned
                    for(unsigned int a = 0; a < aSize-1; a++)
                        igen.push(Variable("", type));
                }
                else //Else normal variable
                {
                    igen.push(Variable(identifier, type));
                }
            }
            newScope.argumentCount = argumentNames.size();
            functionCallStack.emplace_back(newScope);
        }
        openScopeStack.emplace_back(newScope);
        scopeDepth++;
    }
    else if(line[0] == "}") //Scope close
    {
        scopeDepth--;
        if(scopeDepth < 0) //No scope to close!
        {
            throw std::string("No such scope to close");
        }

        //Find which scope it is ending
        for(auto iter = openScopeStack.begin(); iter != openScopeStack.end();)
        {
            Scope &current = *iter;

            if(current.scopeDepth == scopeDepth) //We've found the scope that's ending
            {
                if(current.startPos == bytecode.size() && current.type != Scope::FUNCTION) //If the scope was empty, optimise it out
                {
                    bytecode.erase(bytecode.begin() + current.bytecodeSizeBefore, bytecode.end());
                    current.wasOptimisedOut = true;
                    current.endPos = bytecode.size();
                    pastScopes.emplace_back(current);
                    displayWarning("Empty scope. It has been optimised out, but removal is recommended.");
                    return;
                }


                //Called to clear this scope's variables
                auto clearScopeVariables = [&](unsigned int extraAmount = 0)
                {
                    //Remove variables created in the scope IF there's any
                    if(igen.getStackSize() != current.stackSize || extraAmount > 0)
                    {
                        igen.genStackWalk((igen.getStackSize() - current.stackSize) + extraAmount);
                    }
                };

                //Handle the scope end differently depending on its type
                if(current.type == Scope::IF) //If an IF scope is ending
                {
                    clearScopeVariables();

                    //Set the bytecode position to seek to if the IF statement should not run
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::WHILE) //If a WHILE scope is ending
                {
                    clearScopeVariables();

                    //Add the instructions to loop back around to the beginning of the while
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::FOR) //If a FOR scope is ending
                {
                    clearScopeVariables();

                    //Parse and insert increment instructions
                    std::vector<std::string> arguments = parser.extractBracketArguments(current.incrementor);
                    std::vector<std::vector<std::string>> initialisationArguments;
                    parser.tokenizeFile({arguments[0]}, initialisationArguments);

                    //Add the instructions to loop back around to the beginning of the for
                    processVariable(initialisationArguments[0]);
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;

                    //Remove initialization variables if needed
                    igen.genStackWalk(current.initialisationVariableCount);
                }
                else if(current.type == Scope::ELSE)
                {
                    clearScopeVariables();

                    Scope &previousScope = pastScopes.back(); // Get preceding scope
                    if(!previousScope.wasOptimisedOut)
                        bytecode[previousScope.endPos-1] = bytecode.size(); //Set the previous if's goto to this point after the else
                }
                else if(current.type == Scope::FUNCTION)
                {
                    //Get scope to return to from function stack
                    Scope endingScope = functionCallStack.back();
                    functionCallStack.pop_back();

                    //Set the function return gotos for this scope
                    while(!functionEndGotos.empty() && functionEndGotos.back().first == functionCallStack.size())
                    {
                        bytecode[functionEndGotos.back().second] = bytecode.size();
                        functionEndGotos.pop_back();
                    }

                    //Erase variables created except the exit point
                    unsigned int variablesToRemove = igen.getStackSize() - endingScope.stackSize;
                    if(variablesToRemove > 0 && endingScope.identifier != "entry") //Only resize if there's things to remove and this isn't the program end
                    {
                        igen.genStackWalk(variablesToRemove);
                    }

                    //Insert the dynamic goto IF it's not the program entry point
                    if(endingScope.identifier != "entry")
                    {
                        igen.push(Variable("returnPoint", DataType::INT));
                        igen.genDynamicGoto();
                    }
                }
                else
                {
                    throw std::string("Ending unknown scope type");
                }

                //Store the scope in pastScopes and erase it from currentScopes as it's no longer open
                current.endPos = bytecode.size();
                if(openScopeStack.size() > 1 && openScopeStack[openScopeStack.size()-2].type == Scope::CLASS) //If scope was created inside of a class, store in that class's past scope list
                {
                    openScopeStack[openScopeStack.size()-2].childMemberScopes.emplace_back(*iter);
                }
                else //Else store in the global past scope list
                {
                    pastScopes.emplace_back(*iter);
                }
                iter = openScopeStack.erase(iter);
                break;
            }
            else
            {
                iter++;
            }

        }
    }
    else
    {
        throw std::string("Error processing scope change, unknown operator '" + line[0] + "'");
    }
}